

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

oonf_layer2_net * oonf_layer2_net_add(char *ifname)

{
  avl_node *paVar1;
  oonf_layer2_net *dest;
  long lVar2;
  
  if (ifname != (char *)0x0) {
    paVar1 = avl_find(&_oonf_layer2_net_tree,ifname);
    if (paVar1 != (avl_node *)0x0) {
      return (oonf_layer2_net *)&paVar1[-0x23].list.prev;
    }
    dest = (oonf_layer2_net *)oonf_class_malloc(&_l2network_class);
    if (dest != (oonf_layer2_net *)0x0) {
      strscpy((char *)dest,ifname,0x10);
      (dest->_node).key = dest;
      avl_insert(&_oonf_layer2_net_tree,&dest->_node);
      avl_init(&dest->neighbors,oonf_layer2_avlcmp_neigh_key,false);
      avl_init(&dest->local_peer_ips,avl_comp_netaddr,false);
      avl_init(&dest->remote_neighbor_ips,avl_comp_netaddr,true);
      (dest->if_listener).name = (char *)dest;
      os_interface_linux_add(&dest->if_listener);
      for (lVar2 = 0; lVar2 != 0x280; lVar2 = lVar2 + 0x28) {
        *(char **)((long)&dest->data[0]._meta + lVar2) = _metadata_net[0].key + lVar2;
      }
      for (lVar2 = 0; lVar2 != 0x410; lVar2 = lVar2 + 0x28) {
        *(char **)((long)&dest->neighdata[0]._meta + lVar2) = _metadata_neigh[0].key + lVar2;
      }
      oonf_class_event(&_l2network_class,dest,OONF_OBJECT_ADDED);
      return dest;
    }
  }
  return (oonf_layer2_net *)0x0;
}

Assistant:

struct oonf_layer2_net *
oonf_layer2_net_add(const char *ifname) {
  struct oonf_layer2_net *l2net;
  enum oonf_layer2_network_index netidx;
  enum oonf_layer2_neighbor_index neighidx;

  if (!ifname) {
    return NULL;
  }

  l2net = avl_find_element(&_oonf_layer2_net_tree, ifname, l2net, _node);
  if (l2net) {
    return l2net;
  }

  l2net = oonf_class_malloc(&_l2network_class);
  if (!l2net) {
    return NULL;
  }

  /* initialize key */
  strscpy(l2net->name, ifname, sizeof(l2net->name));

  /* add to global l2net tree */
  l2net->_node.key = l2net->name;
  avl_insert(&_oonf_layer2_net_tree, &l2net->_node);

  /* initialize tree of neighbors, ips and proxies */
  avl_init(&l2net->neighbors, oonf_layer2_avlcmp_neigh_key, false);
  avl_init(&l2net->local_peer_ips, avl_comp_netaddr, false);
  avl_init(&l2net->remote_neighbor_ips, avl_comp_netaddr, true);

  /* initialize interface listener */
  l2net->if_listener.name = l2net->name;
  os_interface_add(&l2net->if_listener);

  /* initialize data sections */
  for (netidx=0; netidx<OONF_LAYER2_NET_COUNT; netidx++) {
    l2net->data[netidx]._meta = oonf_layer2_net_metadata_get(netidx);
  }
  for (neighidx=0; neighidx<OONF_LAYER2_NEIGH_COUNT; neighidx++) {
    l2net->neighdata[neighidx]._meta = oonf_layer2_neigh_metadata_get(neighidx);
  }

  oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_ADDED);

  return l2net;
}